

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifcar(bifcxdef *ctx,int argc)

{
  runsdef *prVar1;
  runcxdef *ctx_00;
  short *psVar2;
  runsdef val;
  runsdef local_10;
  
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  ctx_00 = ctx->bifcxrun;
  if (prVar1[-1].runstyp != '\a') {
    ctx_00->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3fc);
  }
  psVar2 = (short *)(ctx_00->runcxsp->runsv).runsvstr;
  if (*psVar2 == 2) {
    runpush(ctx_00,5,&local_10);
    return;
  }
  runpbuf(ctx_00,(uint)*(byte *)(psVar2 + 1),(void *)((long)psVar2 + 3));
  return;
}

Assistant:

void bifcar(bifcxdef *ctx, int argc)
{
    uchar   *lstp;
    uint     lstsiz;
    runsdef  val;
    
    bifcntargs(ctx, 1, argc);
    bifchkarg(ctx, DAT_LIST);
    
    lstp = runpoplst(ctx->bifcxrun);
    
    /* get list's size, and point to its data string */
    lstsiz = osrp2(lstp) - 2;
    lstp += 2;
    
    /* push first element if one is present, otherwise push nil */
    if (lstsiz)
        runpbuf(ctx->bifcxrun, *lstp, lstp+1);
    else
        runpush(ctx->bifcxrun, DAT_NIL, &val);
}